

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

void pty_pre_init(void)

{
  __uid_t _Var1;
  __uid_t _Var2;
  __gid_t _Var3;
  __gid_t _Var4;
  int iVar5;
  __pid_t _Var6;
  Pty *pty;
  ssize_t sVar7;
  passwd *ppVar8;
  size_t __n;
  char *__s;
  uint uVar9;
  int pipefd [2];
  timeval local_148;
  char buffer [128];
  char display [128];
  
  pty = new_pty_struct();
  single_pty = pty;
  pty_setup_sigchld_handler();
  pty->master_fd = -1;
  pty->slave_fd = -1;
  pty_stamped_utmp = '\0';
  _Var1 = geteuid();
  _Var2 = getuid();
  if (_Var1 == _Var2) {
    _Var3 = getegid();
    _Var4 = getgid();
    if (_Var3 != _Var4) goto LAB_00112119;
  }
  else {
LAB_00112119:
    pty_open_master(pty);
    iVar5 = pipe(pipefd);
    if (iVar5 < 0) {
      __s = "pterm: pipe";
      goto LAB_001121bb;
    }
    cloexec(pipefd[0]);
    cloexec(pipefd[1]);
    _Var6 = fork();
    if (_Var6 < 0) {
      __s = "pterm: fork";
      goto LAB_001121bb;
    }
    if (_Var6 == 0) {
      close(pipefd[1]);
      while( true ) {
        sVar7 = read(pipefd[0],buffer,0x80);
        uVar9 = (uint)sVar7;
        if ((int)uVar9 < 1) break;
        if (pty_stamped_utmp == '\0') {
          __n = (size_t)(uVar9 & 0x7fffffff);
          if (0x7f < __n) {
            __n = 0x80;
          }
          memcpy(display,buffer,__n);
          if (buffer[uVar9 - 1] == '\0') {
            display[0x7f] = '\0';
            putty_signal(1,fatal_sig_handler);
            putty_signal(2,fatal_sig_handler);
            putty_signal(3,fatal_sig_handler);
            putty_signal(4,fatal_sig_handler);
            putty_signal(6,fatal_sig_handler);
            putty_signal(8,fatal_sig_handler);
            putty_signal(0xd,fatal_sig_handler);
            putty_signal(0xe,fatal_sig_handler);
            putty_signal(0xf,fatal_sig_handler);
            putty_signal(0xb,fatal_sig_handler);
            putty_signal(10,fatal_sig_handler);
            putty_signal(0xc,fatal_sig_handler);
            putty_signal(7,fatal_sig_handler);
            putty_signal(0x1d,fatal_sig_handler);
            putty_signal(0x1b,fatal_sig_handler);
            putty_signal(0x1f,fatal_sig_handler);
            putty_signal(5,fatal_sig_handler);
            putty_signal(0x1a,fatal_sig_handler);
            putty_signal(0x18,fatal_sig_handler);
            putty_signal(0x19,fatal_sig_handler);
            putty_signal(0x1d,fatal_sig_handler);
            _Var1 = getuid();
            ppVar8 = getpwuid(_Var1);
            if (ppVar8 != (passwd *)0x0) {
              memset(&utmp_entry,0,0x180);
              utmp_entry.ut_type = 7;
              utmp_entry.ut_pid = getpid();
              strncpy(utmp_entry.ut_line,pty->name + 5,0x20);
              strncpy(utmp_entry.ut_id,pty->name + 8,4);
              strncpy(utmp_entry.ut_user,ppVar8->pw_name,0x20);
              strncpy(utmp_entry.ut_host,display,0x100);
              gettimeofday(&local_148,(__timezone_ptr_t)0x0);
              utmp_entry.ut_tv.tv_usec = (__int32_t)local_148.tv_usec;
              utmp_entry.ut_tv.tv_sec = (__int32_t)local_148.tv_sec;
              setutxent();
              pututxline((utmpx *)&utmp_entry);
              endutxent();
              updwtmpx("/var/log/wtmp",(utmpx *)&utmp_entry);
              pty_stamped_utmp = '\x01';
            }
          }
        }
      }
      cleanup_utmp();
      _exit(0);
    }
    close(pipefd[0]);
    pty_utmp_helper_pipe = pipefd[1];
  }
  _Var3 = getgid();
  _Var1 = getuid();
  iVar5 = setresgid(_Var3,_Var3,_Var3);
  if (iVar5 < 0) {
    __s = "setresgid";
  }
  else {
    iVar5 = setresuid(_Var1,_Var1,_Var1);
    if (-1 < iVar5) {
      return;
    }
    __s = "setresuid";
  }
LAB_001121bb:
  perror(__s);
  exit(1);
}

Assistant:

void pty_pre_init(void)
{
#ifndef NO_PTY_PRE_INIT

    Pty *pty;

#ifndef OMIT_UTMP
    pid_t pid;
    int pipefd[2];
#endif

    pty = single_pty = new_pty_struct();

    /* set the child signal handler straight away; it needs to be set
     * before we ever fork. */
    pty_setup_sigchld_handler();
    pty->master_fd = pty->slave_fd = -1;
#ifndef OMIT_UTMP
    pty_stamped_utmp = false;
#endif

    if (geteuid() != getuid() || getegid() != getgid()) {
        pty_open_master(pty);

#ifndef OMIT_UTMP
        /*
         * Fork off the utmp helper.
         */
        if (pipe(pipefd) < 0) {
            perror("pterm: pipe");
            exit(1);
        }
        cloexec(pipefd[0]);
        cloexec(pipefd[1]);
        pid = fork();
        if (pid < 0) {
            perror("pterm: fork");
            exit(1);
        } else if (pid == 0) {
            char display[128], buffer[128];
            int dlen, ret;

            close(pipefd[1]);
            /*
             * Now sit here until we receive a display name from the
             * other end of the pipe, and then stamp utmp. Unstamp utmp
             * again, and exit, when the pipe closes.
             */

            dlen = 0;
            while (1) {

                ret = read(pipefd[0], buffer, lenof(buffer));
                if (ret <= 0) {
                    cleanup_utmp();
                    _exit(0);
                } else if (!pty_stamped_utmp) {
                    if (dlen < lenof(display))
                        memcpy(display+dlen, buffer,
                               min(ret, lenof(display)-dlen));
                    if (buffer[ret-1] == '\0') {
                        /*
                         * Now we have a display name. NUL-terminate
                         * it, and stamp utmp.
                         */
                        display[lenof(display)-1] = '\0';
                        /*
                         * Trap as many fatal signals as we can in the
                         * hope of having the best possible chance to
                         * clean up utmp before termination. We are
                         * unfortunately unprotected against SIGKILL,
                         * but that's life.
                         */
                        putty_signal(SIGHUP, fatal_sig_handler);
                        putty_signal(SIGINT, fatal_sig_handler);
                        putty_signal(SIGQUIT, fatal_sig_handler);
                        putty_signal(SIGILL, fatal_sig_handler);
                        putty_signal(SIGABRT, fatal_sig_handler);
                        putty_signal(SIGFPE, fatal_sig_handler);
                        putty_signal(SIGPIPE, fatal_sig_handler);
                        putty_signal(SIGALRM, fatal_sig_handler);
                        putty_signal(SIGTERM, fatal_sig_handler);
                        putty_signal(SIGSEGV, fatal_sig_handler);
                        putty_signal(SIGUSR1, fatal_sig_handler);
                        putty_signal(SIGUSR2, fatal_sig_handler);
#ifdef SIGBUS
                        putty_signal(SIGBUS, fatal_sig_handler);
#endif
#ifdef SIGPOLL
                        putty_signal(SIGPOLL, fatal_sig_handler);
#endif
#ifdef SIGPROF
                        putty_signal(SIGPROF, fatal_sig_handler);
#endif
#ifdef SIGSYS
                        putty_signal(SIGSYS, fatal_sig_handler);
#endif
#ifdef SIGTRAP
                        putty_signal(SIGTRAP, fatal_sig_handler);
#endif
#ifdef SIGVTALRM
                        putty_signal(SIGVTALRM, fatal_sig_handler);
#endif
#ifdef SIGXCPU
                        putty_signal(SIGXCPU, fatal_sig_handler);
#endif
#ifdef SIGXFSZ
                        putty_signal(SIGXFSZ, fatal_sig_handler);
#endif
#ifdef SIGIO
                        putty_signal(SIGIO, fatal_sig_handler);
#endif
                        setup_utmp(pty->name, display);
                    }
                }
            }
        } else {
            close(pipefd[0]);
            pty_utmp_helper_pid = pid;
            pty_utmp_helper_pipe = pipefd[1];
        }
#endif
    }

    /* Drop privs. */
    {
#if HAVE_SETRESUID && HAVE_SETRESGID
        int gid = getgid(), uid = getuid();
        int setresgid(gid_t, gid_t, gid_t);
        int setresuid(uid_t, uid_t, uid_t);
        if (setresgid(gid, gid, gid) < 0) {
            perror("setresgid");
            exit(1);
        }
        if (setresuid(uid, uid, uid) < 0) {
            perror("setresuid");
            exit(1);
        }
#else
        if (setgid(getgid()) < 0) {
            perror("setgid");
            exit(1);
        }
        if (setuid(getuid()) < 0) {
            perror("setuid");
            exit(1);
        }
#endif
    }

#endif /* NO_PTY_PRE_INIT */

}